

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_new_part(REF_GRID ref_grid,REF_INT npart,REF_INT *new_part)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *new_part_local;
  REF_INT npart_local;
  REF_GRID ref_grid_local;
  
  if ((1 < ref_grid->mpi->n) && (1 < npart)) {
    switch(ref_grid->partitioner) {
    case REF_MIGRATE_RECOMMENDED:
    case REF_MIGRATE_PARMETIS:
    case REF_MIGRATE_ZOLTAN_GRAPH:
    case REF_MIGRATE_ZOLTAN_RCB:
      uVar1 = ref_migrate_native_rcb_part(ref_grid,npart,new_part);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x551,"ref_migrate_new_part",(ulong)uVar1,"single by method");
        return uVar1;
      }
      break;
    case REF_MIGRATE_SINGLE:
      uVar1 = ref_migrate_single_part(ref_grid,new_part);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x533,"ref_migrate_new_part",(ulong)uVar1,"single by method");
        return uVar1;
      }
      break;
    case REF_MIGRATE_NATIVE_RCB:
      uVar1 = ref_migrate_native_rcb_part(ref_grid,npart,new_part);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x537,"ref_migrate_new_part",(ulong)uVar1,"single by method");
        return uVar1;
      }
      break;
    case REF_MIGRATE_LAST:
    default:
      if (ref_grid->mpi->id == 0) {
        printf("requested partitioner method %d is not recognized or configured\n",
               (ulong)ref_grid->partitioner);
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x55b,"ref_migrate_new_part",6,"ref_migrate_method");
      return 6;
    }
    ref_grid_local._4_4_ = ref_migrate_report_load_balance(ref_grid,npart,new_part);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x55f,"ref_migrate_new_part",(ulong)ref_grid_local._4_4_,"report bal");
    }
    return ref_grid_local._4_4_;
  }
  uVar1 = ref_migrate_single_part(ref_grid,new_part);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x52d
           ,"ref_migrate_new_part",(ulong)uVar1,"single by nproc");
    return uVar1;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_new_part(REF_GRID ref_grid, REF_INT npart,
                                               REF_INT *new_part) {
  /* synchronize_globals and collect_ghost_age by ref_migrate_to_balance */

  if (!ref_mpi_para(ref_grid_mpi(ref_grid)) || (2 > npart)) {
    RSS(ref_migrate_single_part(ref_grid, new_part), "single by nproc");
    return REF_SUCCESS;
  }

  switch (ref_grid_partitioner(ref_grid)) {
    case REF_MIGRATE_SINGLE:
      RSS(ref_migrate_single_part(ref_grid, new_part), "single by method");
      break;
    case REF_MIGRATE_NATIVE_RCB:
      RSS(ref_migrate_native_rcb_part(ref_grid, npart, new_part),
          "single by method");
      break;
    case REF_MIGRATE_ZOLTAN_GRAPH:
    case REF_MIGRATE_ZOLTAN_RCB:
#if defined(HAVE_ZOLTAN) && defined(HAVE_MPI)
      RSS(ref_migrate_zoltan_part(ref_grid, new_part), "zoltan part");
      break;
#endif
    case REF_MIGRATE_PARMETIS:
#if defined(HAVE_PARMETIS) && defined(HAVE_MPI)
      RSS(ref_migrate_parmetis_part(ref_grid, npart, new_part),
          "parmetis part");
      break;
#endif
    case REF_MIGRATE_RECOMMENDED:
#if defined(HAVE_PARMETIS) && defined(HAVE_MPI)
      RSS(ref_migrate_parmetis_part(ref_grid, npart, new_part),
          "parmetis part");
      break;
#endif
#if !defined(HAVE_PARMETIS) && defined(HAVE_ZOLTAN) && defined(HAVE_MPI)
      RSS(ref_migrate_zoltan_part(ref_grid, new_part), "zoltan part");
      break;
#endif
#if !defined(HAVE_PARMETIS) && !defined(HAVE_ZOLTAN)
      RSS(ref_migrate_native_rcb_part(ref_grid, npart, new_part),
          "single by method");
      break;
#endif
    case REF_MIGRATE_LAST:
    default:
      if (ref_grid_once(ref_grid))
        printf(
            "requested partitioner method %d"
            " is not recognized or configured\n",
            (int)ref_grid_partitioner(ref_grid));
      RSS(REF_IMPLEMENT, "ref_migrate_method");
      break;
  }

  RSS(ref_migrate_report_load_balance(ref_grid, npart, new_part), "report bal");

  return REF_SUCCESS;
}